

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::get_coboundary_of_a_cell
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Bitmap_cubical_complex_base<double> *this,size_t cell)

{
  uint uVar1;
  value_type vVar2;
  size_t sVar3;
  size_t sVar4;
  pointer puVar5;
  const_reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  ulong uVar9;
  value_type_conflict local_88;
  value_type_conflict local_80;
  value_type_conflict local_78 [3];
  value_type_conflict local_60;
  uint local_54;
  size_type sStack_50;
  uint position;
  size_t i;
  size_t cell1;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> counter;
  size_t cell_local;
  Bitmap_cubical_complex_base<double> *this_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *coboundary_elements;
  
  counter.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)cell;
  compute_counter_for_given_cell
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,this,cell);
  cell1._7_1_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  i = (size_t)counter.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  for (sStack_50 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             (&this->multipliers); sVar3 = i, 1 < sStack_50;
      sStack_50 = sStack_50 - 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->multipliers,sStack_50 - 1);
    sVar4 = i;
    local_54 = (uint)(sVar3 / *pvVar6);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->multipliers,sStack_50 - 1);
    puVar5 = counter.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    i = sVar4 % (ulong)*pvVar6;
    if ((local_54 & 1) == 0) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->multipliers,sStack_50 - 1);
      if (((pointer)(ulong)*pvVar6 < puVar5) &&
         (pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                              sStack_50 - 1),
         puVar5 = counter.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage, *pvVar7 != 0)) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->multipliers,sStack_50 - 1);
        local_60 = (long)puVar5 - (ulong)*pvVar6;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (__return_storage_ptr__,&local_60);
      }
      puVar5 = counter.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->multipliers,sStack_50 - 1);
      uVar1 = *pvVar6;
      sVar8 = std::vector<double,_std::allocator<double>_>::size(&this->data);
      if ((long)puVar5 + (ulong)uVar1 < sVar8) {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                            sStack_50 - 1);
        vVar2 = *pvVar7;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->sizes,sStack_50 - 1);
        puVar5 = counter.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (vVar2 != *pvVar6 * 2) {
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->multipliers,sStack_50 - 1);
          local_78[0] = (long)puVar5 + (ulong)*pvVar6;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (__return_storage_ptr__,local_78);
        }
      }
    }
  }
  if ((i & 1) == 0) {
    if (((pointer)0x1 <
         counter.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) &&
       (pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0),
       *pvVar7 != 0)) {
      local_80 = (long)counter.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage - 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (__return_storage_ptr__,&local_80);
    }
    uVar9 = (long)counter.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1;
    sVar8 = std::vector<double,_std::allocator<double>_>::size(&this->data);
    if (uVar9 < sVar8) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
      vVar2 = *pvVar7;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->sizes,0);
      if (vVar2 != *pvVar6 * 2) {
        local_88 = (long)counter.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (__return_storage_ptr__,&local_88);
      }
    }
  }
  cell1._7_1_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::size_t> Bitmap_cubical_complex_base<T>::get_coboundary_of_a_cell(std::size_t cell) const {
  std::vector<unsigned> counter = this->compute_counter_for_given_cell(cell);
  std::vector<std::size_t> coboundary_elements;
  std::size_t cell1 = cell;
  for (std::size_t i = this->multipliers.size(); i > 1; --i) {
    // It is a bit sad to recompute those divisions when we just did them in compute_counter_for_given_cell.
    unsigned position = cell1 / this->multipliers[i - 1];
    cell1 = cell1 % this->multipliers[i - 1];
    if (position % 2 == 0) {
      if ((cell > this->multipliers[i - 1]) && (counter[i - 1] != 0)) {
        coboundary_elements.push_back(cell - this->multipliers[i - 1]);
      }
      if ((cell + this->multipliers[i - 1] < this->data.size()) && (counter[i - 1] != 2 * this->sizes[i - 1])) {
        coboundary_elements.push_back(cell + this->multipliers[i - 1]);
      }
    }
  }
  if (cell1 % 2 == 0) {
    if ((cell > 1) && (counter[0] != 0)) {
      coboundary_elements.push_back(cell - 1);
    }
    if ((cell + 1 < this->data.size()) && (counter[0] != 2 * this->sizes[0])) {
      coboundary_elements.push_back(cell + 1);
    }
  }
  return coboundary_elements;
}